

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O3

Box * trigBox(Box *__return_storage_ptr__,int t,Mesh *m)

{
  Vector3f *this;
  float fVar1;
  long lVar2;
  float *pfVar3;
  int dim;
  int i;
  
  Vector3f::Vector3f(&__return_storage_ptr__->mn,0.0);
  this = &__return_storage_ptr__->mx;
  Vector3f::Vector3f(this,0.0);
  Vector3f::operator=(&__return_storage_ptr__->mn,
                      (Vector3f *)
                      &(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_start[t].field_0x30);
  Vector3f::operator=(this,(Vector3f *)
                           &(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                            _M_impl.super__Vector_impl_data._M_start[t].field_0x30);
  lVar2 = 1;
  do {
    i = 0;
    do {
      pfVar3 = Vector3f::operator[](&__return_storage_ptr__->mn,i);
      fVar1 = *pfVar3;
      pfVar3 = Vector3f::operator[]
                         ((Vector3f *)
                          (&(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                            _M_impl.super__Vector_impl_data._M_start[t].field_0x30 + lVar2 * 0xc),i)
      ;
      if (*pfVar3 <= fVar1 && fVar1 != *pfVar3) {
        pfVar3 = Vector3f::operator[]
                           ((Vector3f *)
                            (&(m->_triangles).
                              super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                              super__Vector_impl_data._M_start[t].field_0x30 + lVar2 * 0xc),i);
        fVar1 = *pfVar3;
        pfVar3 = Vector3f::operator[](&__return_storage_ptr__->mn,i);
        *pfVar3 = fVar1;
      }
      pfVar3 = Vector3f::operator[](this,i);
      fVar1 = *pfVar3;
      pfVar3 = Vector3f::operator[]
                         ((Vector3f *)
                          (&(m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                            _M_impl.super__Vector_impl_data._M_start[t].field_0x30 + lVar2 * 0xc),i)
      ;
      if (fVar1 < *pfVar3) {
        pfVar3 = Vector3f::operator[]
                           ((Vector3f *)
                            (&(m->_triangles).
                              super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                              super__Vector_impl_data._M_start[t].field_0x30 + lVar2 * 0xc),i);
        fVar1 = *pfVar3;
        pfVar3 = Vector3f::operator[](this,i);
        *pfVar3 = fVar1;
      }
      i = i + 1;
    } while (i != 3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Box
trigBox(int t, const Mesh &m) {
    const auto &tri = m.getTriangles();

    Box b;
    b.mn = tri[t].getVertex(0);
    b.mx = tri[t].getVertex(0);

    for (int ii = 1; ii < 3; ii++) {
        for (int dim = 0; dim < 3; dim++) {
            if (b.mn[dim] > tri[t].getVertex(ii)[dim]) {
                b.mn[dim] = tri[t].getVertex(ii)[dim];
            }
            if (b.mx[dim] < tri[t].getVertex(ii)[dim]) {
                b.mx[dim] = tri[t].getVertex(ii)[dim];
            }
        }
    }
    return b;
}